

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseMetaValue
          (AsciiParser *this,VariableDef *def,MetaVariable *outvar)

{
  string *in;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  value_type *v;
  ostream *poVar4;
  value_type *v_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *msg;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> refs;
  MetaVariable var;
  char c;
  optional<tinyusdz::Reference> ref;
  string vartype;
  string varname;
  allocator local_3d9;
  string local_3d8;
  string local_3b8;
  string local_398;
  storage_union local_378;
  undefined **local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_360;
  undefined8 local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [23];
  undefined1 local_1c8 [4];
  float fStack_1c4;
  undefined1 auStack_1c0 [24];
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_198 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_158 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [10];
  string local_70;
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)&local_70,(string *)def);
  in = &def->name;
  ::std::__cxx11::string::string(local_50,(string *)in);
  args = &local_350;
  local_368 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_378.dynamic = (void *)0x0;
  local_358 = 0;
  local_350._M_local_buf[0] = '\0';
  local_360 = args;
  ::std::__cxx11::string::string((string *)local_340[0]._M_local_buf,"[]",(allocator *)local_1c8);
  bVar1 = endsWith(&local_70,(string *)local_340);
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
    ::std::__cxx11::string::string((string *)local_1c8,"[]",(allocator *)&local_3b8);
    removeSuffix((string *)local_340,&local_70,(string *)local_1c8);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)local_340[0]._M_local_buf);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    bVar1 = true;
  }
  else if (def->allow_array_type == true) {
    bVar1 = LookChar1(this,local_340[0]._M_local_buf);
    bVar1 = local_340[0]._M_local_buf[0] == '[' && bVar1;
  }
  else {
    bVar1 = false;
  }
  uVar3 = tinyusdz::value::GetTypeId(&local_70);
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_70,"Reference");
  if (bVar2) {
    if (bVar1) {
      local_398._M_dataplus._M_p = (pointer)0x0;
      local_398._M_string_length = 0;
      local_398.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::Reference>
                        (this,(vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
                              &local_398);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)&local_398);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[ASCII]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa84);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse `{}` in Prim metadataum.",
                   (allocator *)&local_3d8);
        fmt::format<std::__cxx11::string>
                  ((string *)local_1c8,(fmt *)&local_3b8,(string *)in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)&local_398);
    }
    else {
      local_1c8 = (undefined1  [4])((uint)local_1c8 & 0xffffff00);
      memset(auStack_1c0,0,0x150);
      bVar1 = ReadBasicType(this,(optional<tinyusdz::Reference> *)local_1c8);
      if (bVar1) {
        if (local_1c8[0] == (allocator)0x1) {
          v = nonstd::optional_lite::optional<tinyusdz::Reference>::value
                        ((optional<tinyusdz::Reference> *)local_1c8);
          MetaVariable::set_value<tinyusdz::Reference>((MetaVariable *)&local_378,v);
        }
        else {
          MetaVariable::set_value<tinyusdz::value::ValueBlock>
                    ((MetaVariable *)&local_378,(ValueBlock *)local_340[0]._M_local_buf);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[ASCII]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa8c);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_398,"Failed to parse `{}` in Prim metadataum.",
                   (allocator *)&local_3d8);
        fmt::format<std::__cxx11::string>
                  (&local_3b8,(fmt *)&local_398,(string *)in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_3b8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      nonstd::optional_lite::optional<tinyusdz::Reference>::~optional
                ((optional<tinyusdz::Reference> *)local_1c8);
    }
    goto LAB_002f1d97;
  }
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_70,"Payload");
  if (bVar2) {
    if (bVar1) {
      local_398._M_dataplus._M_p = (pointer)0x0;
      local_398._M_string_length = 0;
      local_398.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::Payload>
                        (this,(vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                              &local_398);
      if (bVar1) {
        MetaVariable::set_value<std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_398);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[ASCII]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xa9b);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse `{}` in Prim metadataum.",
                   (allocator *)&local_3d8);
        fmt::format<std::__cxx11::string>
                  ((string *)local_1c8,(fmt *)&local_3b8,(string *)in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_398);
    }
    else {
      local_1c8 = (undefined1  [4])((uint)local_1c8 & 0xffffff00);
      memset(auStack_1c0,0,0x120);
      bVar1 = ReadBasicType(this,(optional<tinyusdz::Payload> *)local_1c8);
      if (bVar1) {
        if (local_1c8[0] == (allocator)0x1) {
          v_00 = nonstd::optional_lite::optional<tinyusdz::Payload>::value
                           ((optional<tinyusdz::Payload> *)local_1c8);
          MetaVariable::set_value<tinyusdz::Payload>((MetaVariable *)&local_378,v_00);
        }
        else {
          MetaVariable::set_value<tinyusdz::value::ValueBlock>
                    ((MetaVariable *)&local_378,(ValueBlock *)local_340[0]._M_local_buf);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[ASCII]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xaa3);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_398,"Failed to parse `{}` in Prim metadataum.",
                   (allocator *)&local_3d8);
        fmt::format<std::__cxx11::string>
                  (&local_3b8,(fmt *)&local_398,(string *)in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_3b8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      nonstd::optional_lite::optional<tinyusdz::Payload>::~optional
                ((optional<tinyusdz::Payload> *)local_1c8);
    }
    goto LAB_002f1d97;
  }
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_70,"Path");
  if (bVar2) {
    if (bVar1) {
      local_398._M_dataplus._M_p = (pointer)0x0;
      local_398._M_string_length = 0;
      local_398.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::Path>
                        (this,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_398)
      ;
      if (bVar1) {
        MetaVariable::set_value<std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_398);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[ASCII]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xab2);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse `{}` in Prim metadatum.",
                   (allocator *)&local_3d8);
        fmt::format<std::__cxx11::string>
                  ((string *)local_1c8,(fmt *)&local_3b8,(string *)in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_398);
    }
    else {
      _local_1c8 = auStack_1c0 + 8;
      auStack_1c0._0_4_ = 0;
      auStack_1c0._4_4_ = 0;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auStack_1c0._8_4_ = (uint)(uint3)auStack_1c0._9_3_ << 8;
      _uStack_1a8 = aaStack_198;
      local_1a0 = 0;
      uStack_19c = 0;
      aaStack_198[0]._M_allocated_capacity._0_4_ = (uint)(uint3)aaStack_198[0]._1_3_ << 8;
      aaStack_198[1]._0_8_ = local_178;
      aaStack_198[1]._8_8_ = 0;
      local_178[0]._M_allocated_capacity = local_178[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_178[1]._0_8_ = aaStack_158;
      local_178[1]._8_8_ = 0;
      aaStack_158[0]._M_allocated_capacity =
           aaStack_158[0]._M_allocated_capacity & 0xffffffffffffff00;
      aaStack_158[1]._0_8_ = local_138;
      aaStack_158[1]._8_8_ = 0;
      local_138[0]._M_local_buf[0] = '\0';
      local_138[1]._0_8_ = local_118;
      local_138[1]._8_8_ = 0;
      local_118[0]._M_local_buf[0] = '\0';
      local_118[1]._0_1_ = 0;
      local_118[1]._4_4_ = 0;
      local_118[1]._8_1_ = 0;
      bVar1 = ReadBasicType(this,(Path *)local_1c8);
      if (bVar1) {
        MetaVariable::set_value<tinyusdz::Path>((MetaVariable *)&local_378,(Path *)local_1c8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[ASCII]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xabb);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_398,"Failed to parse `{}` in Prim metadatum.",
                   (allocator *)&local_3d8);
        fmt::format<std::__cxx11::string>(&local_3b8,(fmt *)&local_398,(string *)in,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_3b8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      Path::~Path((Path *)local_1c8);
    }
    goto LAB_002f1d97;
  }
  if (uVar3 - 6 < 0x4d) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&switchD_002f17bb::switchdataD_004920e0 +
             (long)(int)(&switchD_002f17bb::switchdataD_004920e0)[uVar3 - 6]);
    switch(uVar3) {
    case 6:
      if (bVar1) {
        local_3d8._M_dataplus._M_p = (pointer)0x0;
        local_3d8._M_string_length = 0;
        local_3d8.field_2._M_allocated_capacity = 0;
        bVar1 = ParseBasicTypeArray<tinyusdz::Token>
                          (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                &local_3d8);
        if (bVar1) {
          MetaVariable::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                    ((MetaVariable *)&local_378,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_3d8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5)
          ;
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_1c8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_3d8);
      }
      else {
        _local_1c8 = auStack_1c0 + 8;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = (uint)(uint3)auStack_1c0._9_3_ << 8;
        bVar1 = ReadBasicType(this,(token *)local_1c8);
        if (bVar1) {
          MetaVariable::set_value<tinyusdz::Token>((MetaVariable *)&local_378,(Token *)local_1c8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>(&local_3b8,(fmt *)&local_398,&local_3d8,pbVar5);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_3b8);
          ::std::__cxx11::string::_M_dispose();
LAB_002f692e:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
        }
LAB_002f6933:
        ::std::__cxx11::string::_M_dispose();
      }
      break;
    case 7:
      if (!bVar1) {
        _local_1c8 = auStack_1c0 + 8;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = (uint)(uint3)auStack_1c0._9_3_ << 8;
        bVar1 = ReadBasicType(this,(string *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xacc);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"Failed to parse `string`"
                                    );
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_3b8);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002f692e;
        }
        MetaVariable::set_value<std::__cxx11::string>
                  ((MetaVariable *)&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
        goto LAB_002f6933;
      }
      local_3b8._M_dataplus._M_p = (pointer)0x0;
      local_3b8._M_string_length = 0;
      local_3b8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::__cxx11::string>
                        (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_3b8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_3b8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac6);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"Failed to parse `string[]`"
                                  );
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3b8);
      break;
    default:
      goto switchD_002f17bb_caseD_8;
    case 9:
      if (bVar1) {
        local_1c8 = (undefined1  [4])0x0;
        fStack_1c4 = 0.0;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._8_4_ = 0;
        auStack_1c0._12_4_ = 0;
        auStack_1c0._16_8_ = auStack_1c0._16_8_ & 0xffffffff00000000;
        _uStack_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        bVar1 = ParseBasicTypeArray<bool>(this,(vector<bool,_std::allocator<bool>_> *)local_1c8);
        if (bVar1) {
          MetaVariable::set_value<std::vector<bool,std::allocator<bool>>>
                    ((MetaVariable *)&local_378,(vector<bool,_std::allocator<bool>_> *)local_1c8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}[]`",&local_3d9);
          tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>(&local_3b8,(fmt *)&local_398,&local_3d8,pbVar5);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_3b8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
        }
        ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                  ((_Bvector_base<std::allocator<bool>_> *)local_1c8);
        break;
      }
      bVar1 = ReadBasicType(this,(bool *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<bool>((MetaVariable *)&local_378,(bool *)&local_3d8);
        goto LAB_002f1da0;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
      poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
      ::std::operator<<(poVar4," ");
      ::std::__cxx11::string::string
                ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
      tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
LAB_002f9b72:
      fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
      poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      msg = (string *)local_1c8;
LAB_002f9bca:
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)msg);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      goto LAB_002f9bed;
    case 0xe:
      if (bVar1) {
        local_3d8._M_dataplus._M_p = (pointer)0x0;
        local_3d8._M_string_length = 0;
        local_3d8.field_2._M_allocated_capacity = 0;
        bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                          (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                 *)&local_3d8);
        if (bVar1) {
          MetaVariable::
          set_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                    ((MetaVariable *)&local_378,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &local_3d8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5)
          ;
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_1c8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
        }
        ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                      )&local_3d8);
        break;
      }
      bVar1 = ReadBasicType(this,(half *)&local_3d8);
      if (!bVar1) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
        goto LAB_002f9b72;
      }
      MetaVariable::set_value<tinyusdz::value::half>((MetaVariable *)&local_378,(half *)&local_3d8);
      goto LAB_002f1da0;
    case 0xf:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(int *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<int>((MetaVariable *)&local_378,(int *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<int,std::allocator<int>>>
                  ((MetaVariable *)&local_378,(vector<int,_std::allocator<int>_> *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_3d8);
      break;
    case 0x10:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(int64_t *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<long>((MetaVariable *)&local_378,(long *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<long,std::allocator<long>>>
                  ((MetaVariable *)&local_378,(vector<long,_std::allocator<long>_> *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&local_3d8);
      break;
    case 0x11:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(half2 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::type_name_abi_cxx11_()
          ;
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<tinyusdz::value::half,2ul>>
                  ((MetaVariable *)&local_378,(array<tinyusdz::value::half,_2UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)&local_3d8);
      break;
    case 0x12:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(half3 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::type_name_abi_cxx11_()
          ;
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<tinyusdz::value::half,3ul>>
                  ((MetaVariable *)&local_378,(array<tinyusdz::value::half,_3UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)&local_3d8);
      break;
    case 0x13:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(half4 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::type_name_abi_cxx11_()
          ;
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<tinyusdz::value::half,4ul>>
                  ((MetaVariable *)&local_378,(array<tinyusdz::value::half,_4UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)&local_3d8);
      break;
    case 0x14:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(int2 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<int,2ul>>
                  ((MetaVariable *)&local_378,(array<int,_2UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<int,2ul>>
                        (this,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                    &local_3d8);
      break;
    case 0x15:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(int3 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<int,3ul>>
                  ((MetaVariable *)&local_378,(array<int,_3UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<int,3ul>>
                        (this,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                    &local_3d8);
      break;
    case 0x16:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(int4 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<int,4ul>>
                  ((MetaVariable *)&local_378,(array<int,_4UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<int,4ul>>
                        (this,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                    &local_3d8);
      break;
    case 0x1b:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(uint32_t *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<unsigned_int>((MetaVariable *)&local_378,(uint *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<unsigned_int>
                        (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((MetaVariable *)&local_378,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8);
      break;
    case 0x1c:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(uint64_t *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<unsigned_long>
                  ((MetaVariable *)&local_378,(unsigned_long *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<unsigned_long>
                        (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((MetaVariable *)&local_378,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3d8);
      break;
    case 0x25:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(uint2 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<unsigned_int,2ul>>
                  ((MetaVariable *)&local_378,(array<unsigned_int,_2UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                        (this,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                     *)&local_3d8);
      break;
    case 0x26:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(uint3 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<unsigned_int,3ul>>
                  ((MetaVariable *)&local_378,(array<unsigned_int,_3UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                        (this,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     *)&local_3d8);
      break;
    case 0x27:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(uint4 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<unsigned_int,4ul>>
                  ((MetaVariable *)&local_378,(array<unsigned_int,_4UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                        (this,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     *)&local_3d8);
      break;
    case 0x28:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(float *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<float>((MetaVariable *)&local_378,(float *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<float,std::allocator<float>>>
                  ((MetaVariable *)&local_378,(vector<float,_std::allocator<float>_> *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&local_3d8);
      break;
    case 0x29:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(float2 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<float,2ul>>
                  ((MetaVariable *)&local_378,(array<float,_2UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<float,2ul>>
                        (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     *)&local_3d8);
      break;
    case 0x2a:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(float3 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<float,3ul>>
                  ((MetaVariable *)&local_378,(array<float,_3UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<float,3ul>>
                        (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     *)&local_3d8);
      break;
    case 0x2b:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(float4 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<float,4ul>>
                  ((MetaVariable *)&local_378,(array<float,_4UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<float,4ul>>
                        (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     *)&local_3d8);
      break;
    case 0x2c:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(double *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<double>((MetaVariable *)&local_378,(double *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<double>
                        (this,(vector<double,_std::allocator<double>_> *)&local_3d8);
      if (bVar1) {
        MetaVariable::set_value<std::vector<double,std::allocator<double>>>
                  ((MetaVariable *)&local_378,(vector<double,_std::allocator<double>_> *)&local_3d8)
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_3d8);
      break;
    case 0x2d:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(double2 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<double,2ul>>
                  ((MetaVariable *)&local_378,(array<double,_2UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<double,2ul>>
                        (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     *)&local_3d8);
      break;
    case 0x2e:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(double3 *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<std::array<double,3ul>>
                  ((MetaVariable *)&local_378,(array<double,_3UL> *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<double,3ul>>
                        (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     *)&local_3d8);
      break;
    case 0x2f:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(double4 *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
LAB_002f9595:
          fmt::format<std::__cxx11::string>(&local_3b8,(fmt *)&local_398,&local_3d8,pbVar5);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          msg = &local_3b8;
          goto LAB_002f9bca;
        }
        MetaVariable::set_value<std::array<double,4ul>>
                  ((MetaVariable *)&local_378,(array<double,_4UL> *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<std::array<double,4ul>>
                        (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                  ((MetaVariable *)&local_378,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     *)&local_3d8);
      break;
    case 0x30:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(quath *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::quath>
                  ((MetaVariable *)&local_378,(quath *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::quath>
                        (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *
                    )&local_3d8);
      break;
    case 0x31:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(quatf *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::quatf>
                  ((MetaVariable *)&local_378,(quatf *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::quatf>
                        (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *
                    )&local_3d8);
      break;
    case 0x32:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(quatd *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::quatd>
                  ((MetaVariable *)&local_378,(quatd *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::quatd>
                        (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *
                    )&local_3d8);
      break;
    case 0x33:
      if (!bVar1) {
        local_3d8._M_dataplus._M_p = (pointer)0x3f800000;
        local_3d8._M_string_length = 0x3f80000000000000;
        bVar1 = ReadBasicType(this,(matrix2f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::matrix2f>
                  ((MetaVariable *)&local_378,(matrix2f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                        (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                     *)&local_3d8);
      break;
    case 0x34:
      if (!bVar1) {
        local_1c8 = (undefined1  [4])0x3f800000;
        fStack_1c4 = 0.0;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = 0x3f800000;
        auStack_1c0._12_4_ = 0;
        auStack_1c0._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        uStack_1a8 = 0x3f800000;
        bVar1 = ReadBasicType(this,(matrix3f *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::matrix3f>
                  ((MetaVariable *)&local_378,(matrix3f *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                        (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                     *)&local_3d8);
      break;
    case 0x35:
      if (!bVar1) {
        local_1c8 = (undefined1  [4])0x3f800000;
        fStack_1c4 = 0.0;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = 0;
        auStack_1c0._12_4_ = 0x3f800000;
        auStack_1c0._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        _uStack_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_1a0 = 0x3f800000;
        uStack_19c = 0;
        aaStack_198[0]._M_allocated_capacity._0_4_ = 0;
        aaStack_198[0]._M_allocated_capacity._4_4_ = 0;
        aaStack_198[0]._8_4_ = 0;
        aaStack_198[0]._12_4_ = 0x3f800000;
        bVar1 = ReadBasicType(this,(matrix4f *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::matrix4f>
                  ((MetaVariable *)&local_378,(matrix4f *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                        (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                     *)&local_3d8);
      break;
    case 0x36:
      if (!bVar1) {
        local_1c8 = (undefined1  [4])0x0;
        fStack_1c4 = 1.875;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = 0;
        auStack_1c0._12_4_ = 0;
        auStack_1c0._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        bVar1 = ReadBasicType(this,(matrix2d *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::matrix2d>
                  ((MetaVariable *)&local_378,(matrix2d *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                        (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                     *)&local_3d8);
      break;
    case 0x37:
      if (!bVar1) {
        local_1c8 = (undefined1  [4])0x0;
        fStack_1c4 = 1.875;
        auStack_1c0._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = 0;
        auStack_1c0._12_4_ = 0;
        _uStack_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x3ff0000000000000;
        local_1a0 = 0;
        uStack_19c = 0;
        aaStack_198[0]._M_allocated_capacity._0_4_ = 0;
        aaStack_198[0]._M_allocated_capacity._4_4_ = 0;
        aaStack_198[0]._8_4_ = 0;
        aaStack_198[0]._12_4_ = 0;
        aaStack_198[1]._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        bVar1 = ReadBasicType(this,(matrix3d *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::matrix3d>
                  ((MetaVariable *)&local_378,(matrix3d *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                        (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                     *)&local_3d8);
      break;
    case 0x38:
      if (!bVar1) {
        local_1c8 = (undefined1  [4])0x0;
        fStack_1c4 = 1.875;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = 0;
        auStack_1c0._12_4_ = 0;
        auStack_1c0._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        _uStack_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_1a0 = 0;
        uStack_19c = 0x3ff00000;
        aaStack_198[0]._M_allocated_capacity._0_4_ = 0;
        aaStack_198[0]._M_allocated_capacity._4_4_ = 0;
        aaStack_198[0]._8_4_ = 0;
        aaStack_198[0]._12_4_ = 0;
        aaStack_198[1]._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        aaStack_198[1]._8_8_ = 0;
        local_178[0]._M_allocated_capacity = 0x3ff0000000000000;
        local_178[0]._8_8_ = 0;
        local_178[1]._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_178[1]._8_8_ = 0;
        aaStack_158[0]._M_allocated_capacity = 0;
        aaStack_158[0]._8_8_ = 0x3ff0000000000000;
        bVar1 = ReadBasicType(this,(matrix4d *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::matrix4d>
                  ((MetaVariable *)&local_378,(matrix4d *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                        (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     *)&local_3d8);
      break;
    case 0x3a:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(color3f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::color3f>
                  ((MetaVariable *)&local_378,(color3f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color3f>
                        (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                     *)&local_3d8);
      break;
    case 0x3b:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(color3d *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::color3d>
                  ((MetaVariable *)&local_378,(color3d *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color3d>
                        (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                     *)&local_3d8);
      break;
    case 0x3d:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(color4f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::color4f>
                  ((MetaVariable *)&local_378,(color4f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color4f>
                        (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     *)&local_3d8);
      break;
    case 0x3e:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(color4d *)local_1c8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_398,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
          goto LAB_002f9595;
        }
        MetaVariable::set_value<tinyusdz::value::color4d>
                  ((MetaVariable *)&local_378,(color4d *)local_1c8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::color4d>
                        (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     *)&local_3d8);
      break;
    case 0x3f:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(point3h *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::point3h>
                  ((MetaVariable *)&local_378,(point3h *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::point3h>
                        (this,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                     *)&local_3d8);
      break;
    case 0x40:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(point3f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::point3f>
                  ((MetaVariable *)&local_378,(point3f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::point3f>
                        (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                     *)&local_3d8);
      break;
    case 0x41:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(point3d *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::point3d>
                  ((MetaVariable *)&local_378,(point3d *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::point3d>
                        (this,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                     *)&local_3d8);
      break;
    case 0x42:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(normal3h *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::normal3h>
                  ((MetaVariable *)&local_378,(normal3h *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                        (this,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                     *)&local_3d8);
      break;
    case 0x43:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(normal3f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::normal3f>
                  ((MetaVariable *)&local_378,(normal3f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                        (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     *)&local_3d8);
      break;
    case 0x44:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(normal3d *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::normal3d>
                  ((MetaVariable *)&local_378,(normal3d *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                        (this,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                     *)&local_3d8);
      break;
    case 0x45:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(vector3h *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::vector3h>
                  ((MetaVariable *)&local_378,(vector3h *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                        (this,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                     *)&local_3d8);
      break;
    case 0x46:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(vector3f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::vector3f>
                  ((MetaVariable *)&local_378,(vector3f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                        (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                     *)&local_3d8);
      break;
    case 0x47:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(vector3d *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::vector3d>
                  ((MetaVariable *)&local_378,(vector3d *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                        (this,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                     *)&local_3d8);
      break;
    case 0x49:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(texcoord2h *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::texcoord2h>
                  ((MetaVariable *)&local_378,(texcoord2h *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                        (this,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&local_3d8);
      break;
    case 0x4a:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(texcoord2f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::texcoord2f>
                  ((MetaVariable *)&local_378,(texcoord2f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                        (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&local_3d8);
      break;
    case 0x4b:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(texcoord2d *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::texcoord2d>
                  ((MetaVariable *)&local_378,(texcoord2d *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                        (this,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)&local_3d8);
      break;
    case 0x4c:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(texcoord3h *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::texcoord3h>
                  ((MetaVariable *)&local_378,(texcoord3h *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                        (this,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)&local_3d8);
      break;
    case 0x4d:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(texcoord3f *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::texcoord3f>
                  ((MetaVariable *)&local_378,(texcoord3f *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                        (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&local_3d8);
      break;
    case 0x4e:
      if (!bVar1) {
        bVar1 = ReadBasicType(this,(texcoord3d *)&local_3d8);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_3b8,"Failed to parse a value of type `{}`",&local_3d9);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
          goto LAB_002f9b72;
        }
        MetaVariable::set_value<tinyusdz::value::texcoord3d>
                  ((MetaVariable *)&local_378,(texcoord3d *)&local_3d8);
        goto LAB_002f1da0;
      }
      local_3d8._M_dataplus._M_p = (pointer)0x0;
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_allocated_capacity = 0;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                        (this,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                               *)&local_3d8);
      if (bVar1) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                  ((MetaVariable *)&local_378,
                   (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)&local_3d8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xac1);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_3b8,"Failed to parse a value of type `{}[]`",&local_3d9);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>((string *)local_1c8,(fmt *)&local_3b8,&local_398,pbVar5);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)local_1c8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)&local_3d8);
      break;
    case 0x51:
      if (bVar1) {
        local_3b8._M_dataplus._M_p = (pointer)0x0;
        local_3b8._M_string_length = 0;
        local_3b8.field_2._M_allocated_capacity = 0;
        bVar1 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                          (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                 *)&local_3b8);
        if (bVar1) {
          MetaVariable::
          set_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                    ((MetaVariable *)&local_378,
                     (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                      *)&local_3b8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xad6);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,
                                     "Failed to parse `asset[]`");
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_1c8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
        }
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                &local_3b8);
      }
      else {
        _local_1c8 = auStack_1c0 + 8;
        auStack_1c0._0_4_ = 0;
        auStack_1c0._4_4_ = 0;
        auStack_1c0._8_4_ = (uint)(uint3)auStack_1c0._9_3_ << 8;
        _uStack_1a8 = aaStack_198;
        local_1a0 = 0;
        uStack_19c = 0;
        aaStack_198[0]._M_allocated_capacity._0_4_ = (uint)(uint3)aaStack_198[0]._1_3_ << 8;
        bVar1 = ReadBasicType(this,(AssetPath *)local_1c8);
        if (bVar1) {
          MetaVariable::set_value<tinyusdz::value::AssetPath>
                    ((MetaVariable *)&local_378,(AssetPath *)local_1c8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xadc);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"Failed to parse `asset`")
          ;
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_3b8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
        }
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_1c8);
      }
      break;
    case 0x52:
      auStack_1c0._16_8_ = auStack_1c0;
      auStack_1c0._0_4_ = 0;
      auStack_1c0._8_4_ = 0;
      auStack_1c0._12_4_ = 0;
      local_1a0 = 0;
      uStack_19c = 0;
      _uStack_1a8 = auStack_1c0._16_8_;
      bVar1 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                              *)local_1c8);
      if (bVar1) {
        MetaVariable::
        set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  ((MetaVariable *)&local_378,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_1c8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xae7);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,
                                   "Failed to parse `dictionary`");
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_3b8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)local_1c8);
    }
LAB_002f1d97:
    if (bVar1 != false) {
LAB_002f1da0:
      MetaVariable::operator=(outvar,(MetaVariable *)&local_378);
      bVar1 = true;
      goto LAB_002f9bef;
    }
  }
  else {
switchD_002f17bb_caseD_8:
    ::std::__cxx11::string::string((string *)local_1c8,(string *)&local_70);
    if (bVar1) {
      ::std::__cxx11::string::append(local_1c8);
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340[0]._M_local_buf);
    poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseMetaValue");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xaf2);
    ::std::operator<<(poVar4," ");
    ::std::operator+(&local_3b8,"Unsupported or invalid type for Metadatum:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8)
    ;
    poVar4 = ::std::operator<<((ostream *)local_340[0]._M_local_buf,(string *)&local_3b8);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_3b8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340[0]._M_local_buf);
    ::std::__cxx11::string::_M_dispose();
  }
LAB_002f9bed:
  bVar1 = false;
LAB_002f9bef:
  MetaVariable::~MetaVariable((MetaVariable *)&local_378);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool AsciiParser::ParseMetaValue(const VariableDef &def, MetaVariable *outvar) {
  std::string vartype = def.type;
  const std::string varname = def.name;

  MetaVariable var;

  bool array_qual{false};

  DCOUT("parseMeta: vartype " << vartype);

  if (endsWith(vartype, "[]")) {
    vartype = removeSuffix(vartype, "[]");
    array_qual = true;
  } else if (def.allow_array_type) {  // variable can be array
    // Seek '['
    char c;
    if (LookChar1(&c)) {
      if (c == '[') {
        array_qual = true;
      }
    }
  }

  uint32_t tyid = value::GetTypeId(vartype);

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  // Special treatment for "Reference" and "Payload"
  if (vartype == "Reference") {
    if (array_qual) {
      std::vector<Reference> refs;
      if (!ParseBasicTypeArray(&refs)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      var.set_value(refs);
    } else {
      nonstd::optional<Reference> ref;
      if (!ReadBasicType(&ref)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      if (ref) {
        var.set_value(ref.value());
      } else {
        // None
        var.set_value(value::ValueBlock());
      }
    }
  } else if (vartype == "Payload") {
    if (array_qual) {
      std::vector<Payload> refs;
      if (!ParseBasicTypeArray(&refs)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      var.set_value(refs);
    } else {
      nonstd::optional<Payload> ref;
      if (!ReadBasicType(&ref)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      if (ref) {
        var.set_value(ref.value());
      } else {
        // None
        var.set_value(value::ValueBlock());
      }
    }
  } else if (vartype == value::kPath) {
    if (array_qual) {
      std::vector<Path> paths;
      if (!ParseBasicTypeArray(&paths)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadatum.", def.name));
      }
      var.set_value(paths);

    } else {
      Path path;
      if (!ReadBasicType(&path)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadatum.", def.name));
      }
      var.set_value(path);
    }
  } else {
    switch (tyid) {
      APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
      case value::TYPE_ID_STRING: {
        if (array_qual) {
          std::vector<std::string> strs;
          if (!ParseBasicTypeArray(&strs)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
          }
          var.set_value(strs);
        } else {
          std::string str;
          if (!ReadBasicType(&str)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `string`");
          }
          var.set_value(str);
        }
        break;
      }
      case value::TYPE_ID_ASSET_PATH: {
        if (array_qual) {
          std::vector<value::AssetPath> arrs;
          if (!ParseBasicTypeArray(&arrs)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
          }
          var.set_value(arrs);
        } else {
          value::AssetPath asset;
          if (!ReadBasicType(&asset)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
          }
          var.set_value(asset);
        }
        break;
      }
      case value::TYPE_ID_DICT: {
        Dictionary dict;

        DCOUT("Parse dictionary");
        if (!ParseDict(&dict)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
        }
        var.set_value(dict);
        break;
      }
      default: {
        std::string tyname = vartype;
        if (array_qual) {
          tyname += "[]";
        }
        PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                              tyname);
      }
    }
  }

#undef PARSE_BASE_TYPE

  (*outvar) = var;

  return true;
}